

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O2

FT_Error tt_face_palette_set(TT_Face face,FT_UInt palette_index)

{
  FT_Byte *pFVar1;
  FT_Color *pFVar2;
  ushort uVar3;
  void *pvVar4;
  ushort uVar5;
  FT_Error FVar6;
  FT_Byte *pFVar7;
  FT_Color *pFVar8;
  
  pvVar4 = face->cpal;
  FVar6 = 6;
  if ((pvVar4 != (void *)0x0) && (palette_index < (face->palette_data).num_palettes)) {
    uVar3 = *(ushort *)(*(long *)((long)pvVar4 + 0x10) + (ulong)palette_index * 2);
    uVar5 = uVar3 << 8 | uVar3 >> 8;
    uVar3 = (face->palette_data).num_palette_entries;
    if ((uint)*(ushort *)((long)pvVar4 + 2) < (uint)uVar5 + (uint)uVar3) {
      return 8;
    }
    pFVar7 = (FT_Byte *)((ulong)uVar5 * 4 + *(long *)((long)pvVar4 + 8));
    pFVar8 = face->palette;
    pFVar2 = pFVar8 + uVar3;
    for (; pFVar8 < pFVar2; pFVar8 = pFVar8 + 1) {
      pFVar8->blue = *pFVar7;
      pFVar8->green = pFVar7[1];
      pFVar8->red = pFVar7[2];
      pFVar1 = pFVar7 + 3;
      pFVar7 = pFVar7 + 4;
      pFVar8->alpha = *pFVar1;
    }
    FVar6 = 0;
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_palette_set( TT_Face  face,
                       FT_UInt  palette_index )
  {
    Cpal*  cpal = (Cpal*)face->cpal;

    FT_Byte*   offset;
    FT_Byte*   p;

    FT_Color*  q;
    FT_Color*  limit;

    FT_UShort  color_index;


    if ( !cpal || palette_index >= face->palette_data.num_palettes )
      return FT_THROW( Invalid_Argument );

    offset      = cpal->color_indices + 2 * palette_index;
    color_index = FT_PEEK_USHORT( offset );

    if ( color_index + face->palette_data.num_palette_entries >
           cpal->num_colors )
      return FT_THROW( Invalid_Table );

    p     = cpal->colors + COLOR_SIZE * color_index;
    q     = face->palette;
    limit = q + face->palette_data.num_palette_entries;

    while ( q < limit )
    {
      q->blue  = FT_NEXT_BYTE( p );
      q->green = FT_NEXT_BYTE( p );
      q->red   = FT_NEXT_BYTE( p );
      q->alpha = FT_NEXT_BYTE( p );

      q++;
    }

    return FT_Err_Ok;
  }